

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::AddString
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,string *value)

{
  RepeatedPtrFieldBase *this_00;
  int iVar1;
  LogMessage *other;
  string *psVar2;
  long lVar3;
  int iVar4;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"AddString","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"AddString",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 9) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"AddString",CPPTYPE_STRING);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    iVar1 = this->extensions_offset_;
    if (iVar1 == -1) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4b5);
      other = LogMessage::operator<<(&local_60,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=(&local_61,other);
      LogMessage::~LogMessage(&local_60);
      iVar1 = this->extensions_offset_;
    }
    psVar2 = ExtensionSet::AddString_abi_cxx11_
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (long)iVar1),
                        *(int *)(field + 0x28),(FieldType)field[0x2c],field);
    std::__cxx11::string::_M_assign((string *)psVar2);
    return;
  }
  lVar3 = (long)this->offsets_
                [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >> 3) *
                 -0x11111111];
  this_00 = (RepeatedPtrFieldBase *)((long)&(message->super_MessageLite)._vptr_MessageLite + lVar3);
  iVar1 = *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar3);
  iVar4 = *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar3 + 4);
  if (iVar1 < iVar4) {
    this_00->current_size_ = iVar1 + 1;
    psVar2 = (string *)this_00->elements_[iVar1];
  }
  else {
    if (iVar4 == this_00->total_size_) {
      RepeatedPtrFieldBase::Reserve(this_00,iVar4 + 1);
      iVar4 = this_00->allocated_size_;
    }
    this_00->allocated_size_ = iVar4 + 1;
    psVar2 = StringTypeHandlerBase::New_abi_cxx11_();
    iVar1 = this_00->current_size_;
    this_00->current_size_ = iVar1 + 1;
    this_00->elements_[iVar1] = psVar2;
  }
  std::__cxx11::string::_M_assign((string *)psVar2);
  return;
}

Assistant:

void GeneratedMessageReflection::AddString(
    Message* message, const FieldDescriptor* field,
    const string& value) const {
  USAGE_CHECK_ALL(AddString, REPEATED, STRING);
  if (field->is_extension()) {
    MutableExtensionSet(message)->AddString(field->number(),
                                            field->type(), value, field);
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING:
        *AddField<string>(message, field) = value;
        break;
    }
  }
}